

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double * r8row_min(int m,int n,double *a)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  double *pdVar3;
  double *amin;
  int j;
  int i;
  double *a_local;
  int n_local;
  int m_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)m;
  uVar2 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pdVar3 = (double *)operator_new__(uVar2);
  for (amin._4_4_ = 0; amin._4_4_ < m; amin._4_4_ = amin._4_4_ + 1) {
    pdVar3[amin._4_4_] = a[amin._4_4_];
    for (amin._0_4_ = 1; (int)amin < n; amin._0_4_ = (int)amin + 1) {
      if (a[amin._4_4_ + (int)amin * m] < pdVar3[amin._4_4_]) {
        pdVar3[amin._4_4_] = a[amin._4_4_ + (int)amin * m];
      }
    }
  }
  return pdVar3;
}

Assistant:

double *r8row_min ( int m, int n, double a[] )

//****************************************************************************80
//
//  Purpose:
//
//    R8ROW_MIN returns the minimums of an R8ROW.
//
//  Example:
//
//    A =
//      1  2  3
//      2  6  7
//
//    MIN =
//      1
//      2
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    29 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int M, N, the number of rows and columns in the array.
//
//    Input, double A[M*N], the array to be examined.
//
//    Output, double R8ROW_MIN[M], the minimums of the rows.
//
{
  int i;
  int j;
  double *amin;

  amin = new double[m];

  for ( i = 0; i < m; i++ )
  {
    amin[i] = a[i+0*m];
    for ( j = 1; j < n; j++ )
    {
      if ( a[i+j*m] < amin[i] )
      {
        amin[i] = a[i+j*m];
      }
    }
  }

  return amin;
}